

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceMaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemax(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReduceMaxLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reducemax(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducemax(this);
    this_00 = (ReduceMaxLayerParams *)operator_new(0x30);
    ReduceMaxLayerParams::ReduceMaxLayerParams(this_00);
    (this->layer_).reducemax_ = this_00;
  }
  return (ReduceMaxLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMaxLayerParams* NeuralNetworkLayer::mutable_reducemax() {
  if (!has_reducemax()) {
    clear_layer();
    set_has_reducemax();
    layer_.reducemax_ = new ::CoreML::Specification::ReduceMaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMax)
  return layer_.reducemax_;
}